

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_verify_vector.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalVerifyVector::PhysicalVerifyVector
          (PhysicalVerifyVector *this,PhysicalOperator *child,DebugVectorVerification verification)

{
  pointer *pprVar1;
  idx_t iVar2;
  iterator __position;
  reference_wrapper<duckdb::PhysicalOperator> local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_38,
             &(child->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
            );
  iVar2 = child->estimated_cardinality;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_0199fae8;
  (this->super_PhysicalOperator).type = VERIFY_VECTOR;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).estimated_cardinality = iVar2;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_019c1920;
  this->verification = verification;
  __position._M_current =
       (this->super_PhysicalOperator).children.
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_PhysicalOperator).children.
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40._M_data = child;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&(this->super_PhysicalOperator).children,__position,&local_40);
  }
  else {
    (__position._M_current)->_M_data = child;
    pprVar1 = &(this->super_PhysicalOperator).children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return;
}

Assistant:

PhysicalVerifyVector::PhysicalVerifyVector(PhysicalOperator &child, DebugVectorVerification verification)
    : PhysicalOperator(PhysicalOperatorType::VERIFY_VECTOR, child.GetTypes(), child.estimated_cardinality),
      verification(verification) {
	children.push_back(child);
}